

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

void __thiscall
flatbuffers::python::anon_unknown_0::PythonStubGenerator::StructBuilderArgs
          (PythonStubGenerator *this,StructDef *struct_def,string *prefix,Imports *imports,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  FieldDef *pFVar1;
  StructDef *struct_def_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  pointer ppFVar2;
  Type local_118;
  pointer local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_f8 = (struct_def->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar2 = (struct_def->fields).vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppFVar2 != local_f8;
      ppFVar2 = ppFVar2 + 1) {
    pFVar1 = *ppFVar2;
    if ((pFVar1->value).type.base_type == BASE_TYPE_ARRAY) {
      local_118.base_type = (pFVar1->value).type.element;
      local_118.element = BASE_TYPE_NONE;
      local_118.struct_def._0_4_ = *(undefined4 *)&(pFVar1->value).type.struct_def;
      local_118.struct_def._4_4_ = *(undefined4 *)((long)&(pFVar1->value).type.struct_def + 4);
      local_118.enum_def = (pFVar1->value).type.enum_def;
      local_118.fixed_length = (pFVar1->value).type.fixed_length;
    }
    else {
      local_118.base_type = (pFVar1->value).type.base_type;
      local_118.element = (pFVar1->value).type.element;
      local_118.struct_def._0_4_ = *(undefined4 *)&(pFVar1->value).type.struct_def;
      local_118.struct_def._4_4_ = *(undefined4 *)((long)&(pFVar1->value).type.struct_def + 4);
      local_118.enum_def = (pFVar1->value).type.enum_def;
      local_118.fixed_length = (pFVar1->value).type.fixed_length;
      local_118._26_6_ = *(undefined6 *)&(pFVar1->value).type.field_0x1a;
    }
    if (local_118.base_type == BASE_TYPE_STRUCT) {
      struct_def_00 = (pFVar1->value).type.struct_def;
      (*(this->namer_).super_Namer._vptr_Namer[0x12])(&local_f0);
      std::operator+(&local_70,prefix,&local_f0);
      std::operator+(&local_50,&local_70,"_");
      StructBuilderArgs(this,struct_def_00,&local_50,imports,args);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      this_00 = &local_f0;
    }
    else {
      (*(this->namer_).super_Namer._vptr_Namer[0x12])(&local_b0);
      std::operator+(&local_90,prefix,&local_b0);
      std::operator+(&local_f0,&local_90,": ");
      (anonymous_namespace)::PythonStubGenerator::TypeOf_abi_cxx11_
                (&local_d0,(PythonStubGenerator *)this,&local_118,imports);
      std::operator+(&local_70,&local_f0,&local_d0);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)args,&local_70
                );
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_90);
      this_00 = &local_b0;
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  return;
}

Assistant:

void StructBuilderArgs(const StructDef &struct_def, const std::string prefix,
                         Imports *imports,
                         std::vector<std::string> *args) const {
    for (const FieldDef *field : struct_def.fields.vec) {
      const Type type = IsArray(field->value.type)
                            ? field->value.type.VectorType()
                            : field->value.type;
      if (type.base_type == BASE_TYPE_STRUCT) {
        StructBuilderArgs(*field->value.type.struct_def,
                          prefix + namer_.Field(*field) + "_", imports, args);
      } else {
        args->push_back(prefix + namer_.Field(*field) + ": " +
                        TypeOf(type, imports));
      }
    }
  }